

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_t *psVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ConstantValue *pCVar4;
  Type *pTVar5;
  Symbol *pSVar6;
  pointer pSVar7;
  pointer pSVar8;
  size_type sVar9;
  pointer pSVar10;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  pSVar7 = (pointer)detail::allocArray(capacity,0x28);
  *(Symbol **)((long)pSVar7 + lVar11 + 0x20) = (args->fieldEnd).current;
  pCVar4 = args->val;
  pTVar5 = args->type;
  pSVar6 = (args->fieldIt).current;
  psVar1 = (size_t *)((long)pSVar7 + lVar11 + 0x10);
  *psVar1 = args->valIndex;
  psVar1[1] = (size_t)pSVar6;
  *(undefined8 *)((long)pSVar7 + lVar11) = pCVar4;
  ((undefined8 *)((long)pSVar7 + lVar11))[1] = pTVar5;
  pSVar8 = this->data_;
  sVar9 = this->len;
  if (pSVar8 + sVar9 == pos) {
    pSVar10 = pSVar7;
    if (sVar9 != 0) {
      do {
        (pSVar10->fieldEnd).current = (pSVar8->fieldEnd).current;
        pCVar4 = pSVar8->val;
        pTVar5 = pSVar8->type;
        pSVar6 = (pSVar8->fieldIt).current;
        pSVar10->valIndex = pSVar8->valIndex;
        (pSVar10->fieldIt).current = pSVar6;
        pSVar10->val = pCVar4;
        pSVar10->type = pTVar5;
        pSVar8 = pSVar8 + 1;
        pSVar10 = pSVar10 + 1;
      } while (pSVar8 != pos);
    }
  }
  else {
    pSVar10 = pSVar7;
    if (pSVar8 != pos) {
      do {
        (pSVar10->fieldEnd).current = (pSVar8->fieldEnd).current;
        pCVar4 = pSVar8->val;
        pTVar5 = pSVar8->type;
        pSVar6 = (pSVar8->fieldIt).current;
        pSVar10->valIndex = pSVar8->valIndex;
        (pSVar10->fieldIt).current = pSVar6;
        pSVar10->val = pCVar4;
        pSVar10->type = pTVar5;
        pSVar8 = pSVar8 + 1;
        pSVar10 = pSVar10 + 1;
      } while (pSVar8 != pos);
      pSVar8 = this->data_;
      sVar9 = this->len;
    }
    if (pSVar8 + sVar9 != pos) {
      puVar3 = (undefined8 *)((long)pSVar7 + lVar11);
      do {
        puVar3[9] = (pos->fieldEnd).current;
        pCVar4 = pos->val;
        pTVar5 = pos->type;
        pSVar6 = (pos->fieldIt).current;
        puVar3[7] = pos->valIndex;
        puVar3[8] = pSVar6;
        puVar3[5] = pCVar4;
        puVar3[6] = pTVar5;
        pos = pos + 1;
        puVar3 = puVar3 + 5;
      } while (pos != pSVar8 + sVar9);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar7;
  return (pointer)((long)pSVar7 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}